

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_buf.c
# Opt level: O3

ssize_t tnt_buf_read(tnt_stream *s,char *buf,size_t size)

{
  long *plVar1;
  ulong uVar2;
  
  plVar1 = (long *)s->data;
  if (*plVar1 != 0) {
    uVar2 = plVar1[1] - plVar1[3];
    if (uVar2 != 0) {
      if (uVar2 < size) {
        size = uVar2;
      }
      memcpy((void *)(*plVar1 + plVar1[3]),buf,size);
      plVar1[3] = plVar1[3] + size;
      return size;
    }
  }
  return 0;
}

Assistant:

static ssize_t
tnt_buf_read(struct tnt_stream *s, char *buf, size_t size) {
	struct tnt_stream_buf *sb = TNT_SBUF_CAST(s);
	if (sb->data == NULL)
		return 0;
	if (sb->size == sb->rdoff)
		return 0;
	size_t avail = sb->size - sb->rdoff;
	if (size > avail)
		size = avail;
	memcpy(sb->data + sb->rdoff, buf, size);
	sb->rdoff += size;
	return size;
}